

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testHasVolume<Imath_3_2::Vec4<double>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  double *pdVar5;
  char *in_RDI;
  Box<Imath_3_2::Vec4<double>_> b_2;
  Vec4<double> max;
  Vec4<double> min;
  Box<Imath_3_2::Vec4<double>_> b1;
  int hi;
  int lo;
  uint i;
  Vec4<double> p1;
  Vec4<double> p0;
  Box<Imath_3_2::Vec4<double>_> b0;
  Box<Imath_3_2::Vec4<double>_> b_1;
  Box<Imath_3_2::Vec4<double>_> b;
  Box<Imath_3_2::Vec4<double>_> *in_stack_fffffffffffffdd0;
  Vec4<double> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  Box<Imath_3_2::Vec4<double>_> *in_stack_fffffffffffffde8;
  Box<Imath_3_2::Vec4<double>_> *in_stack_fffffffffffffe10;
  Vec4<double> local_1d8;
  Vec4<double> local_1b8 [3];
  int local_154;
  int local_150;
  uint local_14c;
  Vec4<double> local_148;
  Vec4<double> local_128;
  Vec4<double> local_108;
  Vec4<double> local_e8 [7];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec4<double>_>::Box(in_stack_fffffffffffffdd0);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::hasVolume(in_stack_fffffffffffffde8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x34f,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<double>]"
                 );
  }
  Imath_3_2::Box<Imath_3_2::Vec4<double>_>::Box(in_stack_fffffffffffffdd0);
  Imath_3_2::Box<Imath_3_2::Vec4<double>_>::makeInfinite(in_stack_fffffffffffffe10);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::hasVolume(in_stack_fffffffffffffde8);
  if (!bVar1) {
    __assert_fail("b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x358,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<double>]"
                 );
  }
  Imath_3_2::Vec4<double>::Vec4(local_e8,-1.0);
  Imath_3_2::Vec4<double>::Vec4(&local_108,1.0);
  Imath_3_2::Box<Imath_3_2::Vec4<double>_>::Box
            ((Box<Imath_3_2::Vec4<double>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
             ,&in_stack_fffffffffffffdd0->min);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::hasVolume(in_stack_fffffffffffffde8);
  if (!bVar1) {
    __assert_fail("b0.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x363,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<double>]"
                 );
  }
  Imath_3_2::Vec4<double>::Vec4(&local_128);
  Imath_3_2::Vec4<double>::Vec4(&local_148);
  local_14c = 0;
  while( true ) {
    uVar3 = local_14c;
    uVar2 = Imath_3_2::Vec4<double>::dimensions();
    if (uVar2 <= uVar3) break;
    local_150 = 1 << ((char)local_14c + 1U & 0x1f);
    uVar3 = Imath_3_2::Vec4<double>::dimensions();
    local_154 = 1 << ((char)uVar3 - (char)local_14c & 0x1fU);
    in_stack_fffffffffffffdd0 = (Box<Imath_3_2::Vec4<double>_> *)-(double)local_150;
    pdVar5 = Imath_3_2::Vec4<double>::operator[](&local_128,local_14c);
    *pdVar5 = (double)in_stack_fffffffffffffdd0;
    in_stack_fffffffffffffdd8 = (Vec4<double> *)(double)local_154;
    pdVar5 = Imath_3_2::Vec4<double>::operator[](&local_148,local_14c);
    *pdVar5 = (double)in_stack_fffffffffffffdd8;
    local_14c = local_14c + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec4<double>_>::Box
            ((Box<Imath_3_2::Vec4<double>_> *)CONCAT44(uVar3,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->min);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::hasVolume(in_stack_fffffffffffffde8);
  if (!bVar1) {
    __assert_fail("b1.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x36f,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<double>]"
                 );
  }
  Imath_3_2::Vec4<double>::Vec4(local_1b8,0.0);
  Imath_3_2::Vec4<double>::Vec4(&local_1d8,local_1b8);
  uVar2 = Imath_3_2::Vec4<double>::dimensions();
  pdVar5 = Imath_3_2::Vec4<double>::operator[](&local_1d8,uVar2 - 1);
  *pdVar5 = 2.0;
  Imath_3_2::Box<Imath_3_2::Vec4<double>_>::Box
            ((Box<Imath_3_2::Vec4<double>_> *)CONCAT44(uVar3,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->min);
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::hasVolume(in_stack_fffffffffffffde8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x380,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_3_2::Vec4<double>]"
                 );
  }
  return;
}

Assistant:

void
testHasVolume (const char* type)
{
    cout << "    hasVolume() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (!b.hasVolume ());
    }

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite ();
        assert (b.hasVolume ());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (b0.hasVolume ());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            int lo = 1 << (i + 1);
            int hi = 1 << (T::dimensions () - i);
            p0[i] = -static_cast<typename T::BaseType>(lo);
            p1[i] = static_cast<typename T::BaseType>(hi);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
        assert (b1.hasVolume ());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (!b.hasVolume ());
    }
}